

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

void __thiscall
testing::internal::ParameterizedTestCaseInfo<RenderTest>::TestInfo::TestInfo
          (TestInfo *this,char *a_test_case_base_name,char *a_test_base_name,
          TestMetaFactoryBase<TestIntegrator> *a_test_meta_factory)

{
  allocator<char> local_1a;
  allocator<char> local_19;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,a_test_case_base_name,&local_19)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->test_base_name,a_test_base_name,&local_1a);
  (this->test_meta_factory).ptr_ = a_test_meta_factory;
  return;
}

Assistant:

TestInfo(const char* a_test_case_base_name,
             const char* a_test_base_name,
             TestMetaFactoryBase<ParamType>* a_test_meta_factory) :
        test_case_base_name(a_test_case_base_name),
        test_base_name(a_test_base_name),
        test_meta_factory(a_test_meta_factory) {}